

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

size_t ftxui::GlyphIterate(string *input,int glyph_offset,size_t start)

{
  undefined4 local_30;
  undefined4 local_2c;
  int i_1;
  int i;
  size_t start_local;
  int glyph_offset_local;
  string *input_local;
  
  _i_1 = (string *)start;
  if (glyph_offset < 0) {
    for (local_30 = 0; SBORROW4(local_30,-glyph_offset) != local_30 + glyph_offset < 0;
        local_30 = local_30 + 1) {
      _i_1 = (string *)GlyphPrevious(input,(size_t)_i_1);
    }
    input_local = _i_1;
  }
  else {
    for (local_2c = 0; local_2c < glyph_offset; local_2c = local_2c + 1) {
      _i_1 = (string *)GlyphNext(input,(size_t)_i_1);
    }
    input_local = _i_1;
  }
  return (size_t)input_local;
}

Assistant:

size_t GlyphIterate(const std::string& input, int glyph_offset, size_t start) {
  if (glyph_offset >= 0) {
    for (int i = 0; i < glyph_offset; ++i) {
      start = GlyphNext(input, start);
    }
    return start;
  } else {
    for (int i = 0; i < -glyph_offset; ++i) {
      start = GlyphPrevious(input, start);
    }
    return start;
  }
}